

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextWrapped(ImVec2 pos,char *text,char *text_end,float wrap_width)

{
  float font_size;
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImFont *font;
  ImGuiContext_conflict *pIVar2;
  ImU32 col;
  size_t sVar3;
  ImGuiWindow *window;
  ImGuiContext_conflict *g;
  char *pcStack_20;
  float wrap_width_local;
  char *text_end_local;
  char *text_local;
  ImVec2 pos_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pcStack_20 = text_end;
  text_local = (char *)pos;
  if (text_end == (char *)0x0) {
    sVar3 = strlen(text);
    pcStack_20 = text + sVar3;
  }
  if (text != pcStack_20) {
    this = pIVar1->DrawList;
    font = pIVar2->Font;
    font_size = pIVar2->FontSize;
    col = GetColorU32(0,1.0);
    ImDrawList::AddText(this,(ImFont_conflict *)font,font_size,(ImVec2 *)&text_local,col,text,
                        pcStack_20,wrap_width,(ImVec4 *)0x0);
    if ((pIVar2->LogEnabled & 1U) != 0) {
      LogRenderedText((ImVec2 *)&text_local,text,pcStack_20);
    }
  }
  return;
}

Assistant:

void ImGui::RenderTextWrapped(ImVec2 pos, const char* text, const char* text_end, float wrap_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = text + strlen(text); // FIXME-OPT

    if (text != text_end)
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_end, wrap_width);
        if (g.LogEnabled)
            LogRenderedText(&pos, text, text_end);
    }
}